

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neighbor-graph-flooding.c
# Opt level: O3

void mpr_calculate_neighbor_graph_flooding(nhdp_domain *domain,mpr_flooding_data *data)

{
  long lVar1;
  undefined8 *puVar2;
  long lVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0x115,0,0,
             "Calculate neighbor graph for flooding MPRs");
  }
  mpr_init_neighbor_graph(&data->neigh_graph,&_api_interface);
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xde,0,0,
             "Calculate N1 (flooding) for interface %s",(data->current_interface->_node).key);
  }
  puVar2 = (undefined8 *)nhdp_db_get_link_list();
  puVar2 = (undefined8 *)*puVar2;
  while( true ) {
    lVar1 = puVar2[1];
    lVar3 = nhdp_db_get_link_list();
    if (lVar1 == *(long *)(lVar3 + 8)) break;
    *(undefined1 *)(puVar2[-0x12] + 0x24) = 0;
    if (((((nhdp_interface *)puVar2[-0x14] == data->current_interface) &&
         (*(uint *)((long)puVar2 + (long)domain->index * 0x10 + 0x6c) < 0xffff01)) &&
        (*(int *)((long)puVar2 + -0xa4) == 1)) && (*(char *)((long)puVar2 + -0x56) != '\0')) {
      mpr_add_n1_node_to_set
                (&(data->neigh_graph).set_n1,(nhdp_neighbor *)puVar2[-0x12],
                 (nhdp_link *)(puVar2 + -0x3b),0);
    }
    puVar2 = (undefined8 *)*puVar2;
  }
  if (((&log_global_mask)[LOG_MPR] & 1) != 0) {
    oonf_log(1,(ulong)LOG_MPR,"src/nhdp/mpr/neighbor-graph-flooding.c",0xfc,0,0,
             "Calculate N2 for flooding MPRs");
  }
  plVar6 = (data->neigh_graph).set_n1.list_head.next;
  plVar5 = (data->neigh_graph).set_n1.list_head.prev;
  if (plVar6->prev != plVar5) {
    do {
      plVar4 = plVar6[-1].next;
      plVar7 = plVar4[0x1b].next;
      if (plVar7->prev != plVar4[0x1b].prev) {
        do {
          if (((nhdp_interface *)plVar7[-7].prev[0x13].prev == data->current_interface) &&
             (*(uint *)((long)&plVar7[7].next + (long)domain->index * 0xc + 4U) < 0xffff01)) {
            mpr_add_addr_node_to_set(&(data->neigh_graph).set_n2,*(netaddr *)(plVar7 + -8),0);
            plVar4 = plVar6[-1].next;
          }
          plVar7 = plVar7->next;
        } while (plVar7->prev != plVar4[0x1b].prev);
        plVar5 = (data->neigh_graph).set_n1.list_head.prev;
      }
      plVar6 = plVar6->next;
    } while (plVar6->prev != plVar5);
  }
  return;
}

Assistant:

void
mpr_calculate_neighbor_graph_flooding(const struct nhdp_domain *domain, struct mpr_flooding_data *data) {
  OONF_DEBUG(LOG_MPR, "Calculate neighbor graph for flooding MPRs");

  mpr_init_neighbor_graph(&data->neigh_graph, &_api_interface);
  _calculate_n1(domain, data);
  _calculate_n2(domain, data);
}